

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-batched.cpp
# Opt level: O0

int gpt2_decode(gpt2_model *model,ggml_gallocr_t allocr,gpt2_batch batch,int n_threads,
               vector<float,_std::allocator<float>_> *logits)

{
  gpt2_pos gVar1;
  int iVar2;
  reference pvVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  const_reference pvVar7;
  reference pvVar8;
  float *pfVar9;
  size_type sVar10;
  ulong uVar11;
  int iVar12;
  undefined4 in_EDX;
  undefined8 in_RSI;
  int *in_RDI;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar13;
  int in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  long in_stack_00000020;
  long in_stack_00000030;
  int32_t i_3;
  ggml_tensor *inpL;
  int i_2;
  gpt2_seq_id seq_id;
  gpt2_pos pos;
  int j;
  int h_offset;
  int h;
  float neg_inf_v;
  vector<float,_std::allocator<float>_> data_buf;
  int32_t n_kv;
  int32_t n_tokens_1;
  gpt2_kv_cache *kv_cache;
  ggml_tensor *KQ_mask;
  ggml_tensor *embd;
  int32_t v;
  int i_1;
  ggml_tensor *position;
  ggml_tensor *inp_tokens;
  ggml_cgraph *gf;
  int i;
  gpt2_kv_cache *cache;
  int n_vocab;
  gpt2_hparams *hparams;
  int32_t n_tokens;
  bool in_stack_00000177;
  gpt2_batch *in_stack_00000178;
  gpt2_seq_id *in_stack_fffffffffffffe98;
  vector<float,_std::allocator<float>_> *this;
  gpt2_kv_cell *in_stack_fffffffffffffea0;
  vector<float,_std::allocator<float>_> *this_00;
  value_type_conflict2 *in_stack_fffffffffffffea8;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  int local_f4;
  int local_e8;
  int local_dc;
  int local_d4;
  vector<float,_std::allocator<float>_> local_b8;
  int local_a0;
  int local_9c;
  int *local_98;
  vector<float,_std::allocator<float>_> *local_90;
  undefined8 local_88;
  undefined4 local_80;
  int local_7c;
  undefined8 local_78;
  undefined8 local_70;
  ggml_cgraph *local_68;
  _Base_ptr local_60;
  undefined1 local_58;
  int local_4c;
  int *local_48;
  int local_3c;
  int *local_38;
  int local_2c;
  undefined4 local_1c;
  undefined8 local_18;
  int *local_10;
  int local_4;
  
  local_2c = in_stack_00000008;
  local_3c = *in_RDI;
  if (in_stack_00000008 == 0) {
    printf("%s: n_tokens == 0","gpt2_decode");
    local_4 = -1;
  }
  else {
    local_38 = in_RDI;
    local_1c = in_EDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    if (((in_stack_00000010 != 0) || (in_stack_00000018 == 0)) &&
       ((in_stack_00000010 == 0 || (in_stack_00000018 != 0)))) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/gpt-2/main-batched.cpp"
                 ,0x376,"GGML_ASSERT(%s) failed",
                 "(!batch.token && batch.embd) || (batch.token && !batch.embd)");
    }
    local_48 = local_10 + 0x18;
    for (local_4c = 0; local_4c < local_2c; local_4c = local_4c + 1) {
      gVar1 = *(gpt2_pos *)(in_stack_00000020 + (long)local_4c * 4);
      pvVar3 = std::vector<gpt2_kv_cell,_std::allocator<gpt2_kv_cell>_>::operator[]
                         ((vector<gpt2_kv_cell,_std::allocator<gpt2_kv_cell>_> *)(local_48 + 8),
                          (ulong)(uint)(local_48[4] + local_4c));
      pvVar3->pos = gVar1;
      std::vector<gpt2_kv_cell,_std::allocator<gpt2_kv_cell>_>::operator[]
                ((vector<gpt2_kv_cell,_std::allocator<gpt2_kv_cell>_> *)(local_48 + 8),
                 (ulong)(uint)(local_48[4] + local_4c));
      pVar13 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)
                          CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                          in_stack_fffffffffffffea8);
      local_60 = (_Base_ptr)pVar13.first._M_node;
      local_58 = pVar13.second;
    }
    local_48[6] = local_48[4] + local_2c;
    local_68 = gpt2_graph((gpt2_model *)batch._0_8_,in_stack_00000178,in_stack_00000177);
    ggml_gallocr_alloc_graph(local_18,local_68);
    if (in_stack_00000010 == 0) {
      uVar4 = ggml_graph_get_tensor(local_68,"embd");
      iVar12 = local_2c * local_38[2];
      local_88 = uVar4;
      lVar5 = ggml_element_size(uVar4);
      ggml_backend_tensor_set(uVar4,in_stack_00000018,0,iVar12 * lVar5);
    }
    else {
      uVar4 = ggml_graph_get_tensor(local_68,"inp_tokens");
      lVar5 = (long)local_2c;
      local_70 = uVar4;
      lVar6 = ggml_element_size(uVar4);
      ggml_backend_tensor_set(uVar4,in_stack_00000010,0,lVar5 * lVar6);
      local_78 = ggml_graph_get_tensor(local_68,"position");
      for (local_7c = 0; local_7c < local_2c; local_7c = local_7c + 1) {
        local_80 = *(undefined4 *)(in_stack_00000020 + (long)local_7c * 4);
        ggml_backend_tensor_set(local_78,&local_80,(long)local_7c << 2,4);
      }
    }
    local_90 = (vector<float,_std::allocator<float>_> *)ggml_graph_get_tensor(local_68,"KQ_mask");
    local_98 = local_10 + 0x18;
    local_9c = in_stack_00000008;
    local_a0 = local_10[0x1e];
    std::allocator<float>::allocator((allocator<float> *)0x115d3a);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)
               CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
               (size_type)in_stack_fffffffffffffea8,(allocator_type *)in_stack_fffffffffffffea0);
    std::allocator<float>::~allocator((allocator<float> *)0x115d60);
    for (local_d4 = 0; local_d4 < 1; local_d4 = local_d4 + 1) {
      iVar12 = local_a0 * local_9c;
      for (local_dc = 0; local_dc < local_9c; local_dc = local_dc + 1) {
        iVar2 = *(int *)(in_stack_00000020 + (long)local_dc * 4);
        for (local_e8 = 0; local_e8 < local_a0; local_e8 = local_e8 + 1) {
          std::vector<gpt2_kv_cell,_std::allocator<gpt2_kv_cell>_>::operator[]
                    ((vector<gpt2_kv_cell,_std::allocator<gpt2_kv_cell>_> *)(local_98 + 8),
                     (long)local_e8);
          in_stack_fffffffffffffeb7 =
               gpt2_kv_cell::has_seq_id(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
          if ((!(bool)in_stack_fffffffffffffeb7) ||
             (pvVar7 = std::vector<gpt2_kv_cell,_std::allocator<gpt2_kv_cell>_>::operator[]
                                 ((vector<gpt2_kv_cell,_std::allocator<gpt2_kv_cell>_> *)
                                  (local_98 + 8),(long)local_e8), iVar2 < pvVar7->pos)) {
            pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                               (&local_b8,(long)(local_d4 * iVar12 + local_dc * local_a0 + local_e8)
                               );
            *pvVar8 = -INFINITY;
          }
        }
      }
    }
    this = &local_b8;
    this_00 = local_90;
    pfVar9 = std::vector<float,_std::allocator<float>_>::data
                       ((vector<float,_std::allocator<float>_> *)0x115f6a);
    sVar10 = std::vector<float,_std::allocator<float>_>::size(this);
    ggml_backend_tensor_set(this_00,pfVar9,0,sVar10 << 2);
    std::vector<float,_std::allocator<float>_>::~vector(this_00);
    uVar11 = ggml_backend_is_cpu(*(undefined8 *)(local_10 + 0x2a));
    if ((uVar11 & 1) != 0) {
      ggml_backend_cpu_set_n_threads(*(undefined8 *)(local_10 + 0x2a),local_1c);
    }
    ggml_backend_graph_compute(*(undefined8 *)(local_10 + 0x2a),local_68);
    uVar4 = ggml_graph_node(local_68,0xffffffff);
    if (in_stack_00000030 == 0) {
      std::vector<float,_std::allocator<float>_>::resize
                ((vector<float,_std::allocator<float>_> *)
                 CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),(size_type)pfVar9);
      pfVar9 = std::vector<float,_std::allocator<float>_>::data
                         ((vector<float,_std::allocator<float>_> *)0x116121);
      ggml_backend_tensor_get
                (uVar4,pfVar9,(long)(local_3c * (local_2c + -1)) << 2,(long)local_3c << 2);
    }
    else {
      std::vector<float,_std::allocator<float>_>::resize
                ((vector<float,_std::allocator<float>_> *)
                 CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),(size_type)pfVar9);
      for (local_f4 = 0; local_f4 < local_2c; local_f4 = local_f4 + 1) {
        if (*(char *)(in_stack_00000030 + local_f4) != '\0') {
          pfVar9 = std::vector<float,_std::allocator<float>_>::data
                             ((vector<float,_std::allocator<float>_> *)0x116094);
          ggml_backend_tensor_get
                    (uVar4,pfVar9 + local_3c * local_f4,(long)(local_3c * local_f4) << 2,
                     (long)local_3c << 2);
        }
      }
    }
    local_48[4] = local_2c + local_48[4];
    if ((uint)local_48[4] < (uint)local_48[5]) {
      local_4 = 0;
    }
    else {
      printf("%s: cache.head >= cache.size\n","gpt2_decode");
      local_4 = -2;
    }
  }
  return local_4;
}

Assistant:

int gpt2_decode(
        struct gpt2_model &  model,
        ggml_gallocr_t       allocr,
        struct gpt2_batch    batch,
        int                  n_threads,
        std::vector<float> & logits) {
    const int32_t n_tokens = batch.n_tokens;
    const auto &  hparams  = model.hparams;
    const int     n_vocab  = hparams.n_vocab;

    if (n_tokens == 0) {
        printf("%s: n_tokens == 0", __func__);
        return -1;
    }

    GGML_ASSERT((!batch.token && batch.embd) || (batch.token && !batch.embd));

    auto & cache = model.kv_cache;

    for (int i = 0; i < n_tokens; i++) {
        cache.cells[cache.head + i].pos = batch.pos[i];
        cache.cells[cache.head + i].seq_id.insert(batch.seq_id[i]);
    }

    cache.n = cache.head + n_tokens;

    struct ggml_cgraph * gf = gpt2_graph(model, batch, false);

    // allocate tensors
    ggml_gallocr_alloc_graph(allocr, gf);

    // set the graph inputs
    if (batch.token) {
        struct ggml_tensor * inp_tokens = ggml_graph_get_tensor(gf, "inp_tokens");
        ggml_backend_tensor_set(inp_tokens, batch.token, 0, n_tokens*ggml_element_size(inp_tokens));

        struct ggml_tensor * position = ggml_graph_get_tensor(gf, "position");
        for (int i = 0; i < n_tokens; ++i) {
            int32_t v = batch.pos[i];
            ggml_backend_tensor_set(position, &v, i*sizeof(int32_t), sizeof(v));
        }
    } else {
        struct ggml_tensor * embd = ggml_graph_get_tensor(gf, "embd");
        ggml_backend_tensor_set(embd, batch.embd, 0, n_tokens * hparams.n_embd * ggml_element_size(embd));
    }

    {
        struct ggml_tensor * KQ_mask = ggml_graph_get_tensor(gf, "KQ_mask");
        const auto & kv_cache = model.kv_cache;
        const int32_t n_tokens = batch.n_tokens;
        const int32_t n_kv     = kv_cache.n;

        std::vector<float> data_buf(n_kv*n_tokens);
        const float neg_inf_v = -INFINITY;

        for (int h = 0; h < 1; ++h) {
            int h_offset = h*(n_kv*n_tokens);
            for (int j = 0; j < n_tokens; ++j) {
                const gpt2_pos    pos    = batch.pos[j];
                const gpt2_seq_id seq_id = batch.seq_id[j];

                for (int i = 0; i < n_kv; ++i) {
                    if (!kv_cache.cells[i].has_seq_id(seq_id) || kv_cache.cells[i].pos > pos) {
                        data_buf[h_offset + j*n_kv + i] = neg_inf_v;
                    }
                }
            }
        }

        ggml_backend_tensor_set(KQ_mask, data_buf.data(), 0, data_buf.size() * sizeof(float));
    }

    // run the computation
    if (ggml_backend_is_cpu(model.backend)) {
        ggml_backend_cpu_set_n_threads(model.backend, n_threads);
    }
    ggml_backend_graph_compute(model.backend, gf);

    //if (n_past%100 == 0) {
    //    ggml_graph_print   (&gf);
    //    ggml_graph_dump_dot(&gf, NULL, "gpt-2.dot");
    //}

    // in this case, the output tensor is the last one in the graph
    struct ggml_tensor * inpL = ggml_graph_node(gf, -1);

    if (batch.logits) {
        // return logits for all tokens
        logits.resize(n_vocab*n_tokens);
        for (int32_t i = 0; i < n_tokens; i++) {
            if (batch.logits[i] == 0) {
                continue;
            }
            ggml_backend_tensor_get(inpL, logits.data() + n_vocab*i, n_vocab*i*sizeof(float), sizeof(float)*n_vocab);
        }
    } else {
        // return result just for the last token
        logits.resize(n_vocab);
        ggml_backend_tensor_get(inpL, logits.data(), (n_vocab*(n_tokens-1))*sizeof(float), sizeof(float)*n_vocab);
    }

    // update the kv ring buffer
    cache.head += n_tokens;

    // ensure kv cache head points to a valid index.
    if (cache.head >= cache.size) {
        printf("%s: cache.head >= cache.size\n", __func__);
        return -2;
    }

    return 0;
}